

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insyde_fdm.cpp
# Opt level: O0

void __thiscall insyde_fdm_t::~insyde_fdm_t(insyde_fdm_t *this)

{
  insyde_fdm_t *this_local;
  
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__insyde_fdm_t_0026fef0;
  _clean_up(this);
  std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::~unique_ptr
            (&this->m__io__raw_entries);
  std::__cxx11::string::~string((string *)&this->m__raw_entries);
  std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::~unique_ptr
            (&this->m__io__raw_extensions);
  std::__cxx11::string::~string((string *)&this->m__raw_extensions);
  std::unique_ptr<insyde_fdm_t::fdm_entries_t,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>::
  ~unique_ptr(&this->m_entries);
  std::
  unique_ptr<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>::
  ~unique_ptr(&this->m_board_ids);
  std::
  unique_ptr<insyde_fdm_t::fdm_extensions_t,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>::
  ~unique_ptr(&this->m_extensions);
  kaitai::kstruct::~kstruct(&this->super_kstruct);
  return;
}

Assistant:

insyde_fdm_t::~insyde_fdm_t() {
    _clean_up();
}